

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beectl.c
# Opt level: O0

char * get_alternative_editor(void)

{
  uint local_8c;
  uint i;
  str_t fallback_editors [7];
  char *editor;
  
  fallback_editors[6].size = 0;
  memcpy(&stack0xffffffffffffff78,&PTR_anon_var_dwarf_2e7_0010ad60,0x70);
  local_8c = 0;
  while( true ) {
    if (*(long *)(&stack0xffffffffffffff78 + (ulong)local_8c * 0x10) == 0) {
      return (char *)0x0;
    }
    fallback_editors[6].size =
         (size_t)which(*(char **)(&stack0xffffffffffffff78 + (ulong)local_8c * 0x10),
                       (size_t)fallback_editors[local_8c].name);
    if ((char *)fallback_editors[6].size != (char *)0x0) break;
    local_8c = local_8c + 1;
  }
  return (char *)fallback_editors[6].size;
}

Assistant:

static char *
get_alternative_editor ()
{
  char *editor = NULL;
  const str_t fallback_editors[] = {
#ifdef WINDOWS
        { .name = "gedit.exe",        .size = sizeof ("gedit.exe")        },
        { .name = "sublime_text.exe", .size = sizeof ("sublime_text.exe") },
        { .name = "notepad++.exe",    .size = sizeof ("notepad++.exe")    },
        { .name = "notepad.exe",      .size = sizeof ("notepad.exe")      },
#else
        { .name = "gvim",     .size = sizeof ("gvim")     },
        { .name = "sublime",  .size = sizeof ("sublime")  },
        { .name = "gedit",    .size = sizeof ("gedit")    },
        { .name = "kate",     .size = sizeof ("kate")     },
        { .name = "mousepad", .size = sizeof ("mousepad") },
        { .name = "leafpad",  .size = sizeof ("leafpad")  },
#endif
        { .name = NULL, .size = 0 },
  };

  for (unsigned i = 0; fallback_editors[i].name != NULL; i++)
    {
      editor = which (fallback_editors[i].name, fallback_editors[i].size);
      if (editor != NULL)
        return editor;
    }

  return NULL;
}